

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall
CVmObjBigNum::getp_rad2deg(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  char *src;
  size_t prec;
  long *in_FS_OFFSET;
  char *ext1;
  uint hdl1;
  char *new_ext;
  err_frame_t err_cur__;
  char *local_120;
  uint local_114;
  char *local_110;
  uint local_108 [2];
  long local_100;
  void *local_f8;
  __jmp_buf_tag local_f0;
  
  uVar1 = *(ushort *)(this->super_CVmObject).ext_;
  iVar4 = setup_getp_0(this,self,retval,argc,&local_110);
  if (iVar4 == 0) {
    prec = (ulong)uVar1 + 2;
    src = cache_pi(prec);
    alloc_temp_regs(prec,1,&local_120,&local_114);
    G_err_frame::__tls_init();
    local_100 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_108;
    local_108[0] = _setjmp(&local_f0);
    if (local_108[0] == 0) {
      copy_val(local_120,src,1);
      div_by_long(local_120,0xb4,(unsigned_long *)0x0);
      compute_quotient_into(local_110,(char *)0x0,(this->super_CVmObject).ext_,local_120);
    }
    if (-1 < (short)local_108[0]) {
      local_108[0] = local_108[0] | 0x8000;
      release_temp_regs(1,(ulong)local_114);
    }
    lVar2 = local_100;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar2;
    if ((local_108[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar3 = local_f8;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar3;
      err_rethrow();
    }
    if ((local_108[0] & 2) != 0) {
      free(local_f8);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_rad2deg(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1;
    char *ext1;
    const char *pi;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache pi to our working precision */
    pi = cache_pi(prec + 2);

    /* allocate a temporary register for pi/180 */
    alloc_temp_regs(prec + 2, 1, &ext1, &hdl1);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        /* get pi to our precision */
        copy_val(ext1, pi, TRUE);

        /* divide pi by 180 */
        div_by_long(ext1, 180);

        /* divide by pi/180 */
        compute_quotient_into(new_ext, 0, ext_, ext1);
    }